

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessJoiner
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  bool bVar4;
  Value *pVVar5;
  char *pcVar6;
  char *pcVar7;
  string *psVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_00;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  JoinerType type;
  string pskd;
  uint16_t port;
  uint uStack_3d4;
  char *pcStack_3d0;
  size_t local_3c8;
  undefined8 local_3c0;
  format_string_checker<char> *local_3b8;
  parse_func local_3b0 [1];
  Value local_3a0;
  CommissionerAppPtr commissioner;
  string provisioningUrl;
  string local_320;
  uint64_t eui64;
  string local_2f8;
  Error local_2d8;
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  Error local_260;
  Error local_238;
  undefined1 local_210 [40];
  Error local_1e8;
  Error local_1c0;
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  Error local_120;
  Error local_f8;
  Error local_d0;
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar3 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x41) {
    _port = (pointer)((ulong)_port & 0xffffffff00000000);
    pcStack_3d0 = "too few arguments";
    local_3c8 = 0x11;
    local_3c0._0_4_ = 0;
    local_3c0._4_4_ = 0;
    local_3b0[0] = (parse_func)0x0;
    pcVar6 = "too few arguments";
    local_3b8 = (format_string_checker<char> *)&port;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&port);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&port;
    ::fmt::v10::vformat_abi_cxx11_(&pskd,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args)
    ;
    psVar8 = &local_58.mMessage;
    local_58.mCode = kInvalidArgs;
    std::__cxx11::string::string((string *)psVar8,(string *)&pskd);
    Value::Value(&local_3a0,&local_58);
    goto LAB_0011cfcb;
  }
  GetJoinerType((Error *)local_148,&type,pbVar3 + 2);
  Value::Value(&local_3a0,(Error *)local_148);
  pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
  EVar2 = (pVVar5->mError).mCode;
  Value::~Value(&local_3a0);
  std::__cxx11::string::~string((string *)(local_148 + 8));
  if (EVar2 != kNone) goto LAB_0011cff5;
  JobManager::GetSelectedCommissioner
            ((Error *)local_170,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_3a0,(Error *)local_170);
  pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
  EVar2 = (pVVar5->mError).mCode;
  Value::~Value(&local_3a0);
  std::__cxx11::string::~string((string *)(local_170 + 8));
  if (EVar2 != kNone) goto LAB_0011cff5;
  pbVar3 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_3a0,"enable",(allocator *)&port);
  bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  paVar1 = &pskd.field_2;
  if (bVar4) {
    pskd._M_string_length = 0;
    provisioningUrl._M_dataplus._M_p = (pointer)&provisioningUrl.field_2;
    provisioningUrl._M_string_length = 0;
    pskd.field_2._M_local_buf[0] = '\0';
    provisioningUrl.field_2._M_local_buf[0] = '\0';
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <
        (ulong)(type == kMeshCoP) + 4) {
      _port = (pointer)((ulong)_port & 0xffffffff00000000);
      pcStack_3d0 = "too few arguments";
      local_3c8 = 0x11;
      local_3c0._0_4_ = 0;
      local_3c0._4_4_ = 0;
      local_3b0[0] = (parse_func)0x0;
      pcVar6 = "too few arguments";
      pskd._M_dataplus._M_p = (pointer)paVar1;
      local_3b8 = (format_string_checker<char> *)&port;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)&port);
        }
      }
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&port;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_320,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      this_00 = (string *)(local_80 + 8);
      local_80._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_00,(string *)&local_320);
      Value::Value(&local_3a0,(Error *)local_80);
LAB_0011d342:
      Value::operator=(__return_storage_ptr__,&local_3a0);
      Value::~Value(&local_3a0);
      std::__cxx11::string::~string(this_00);
      psVar8 = &local_320;
LAB_0011d36a:
      std::__cxx11::string::~string((string *)psVar8);
    }
    else {
      pskd._M_dataplus._M_p = (pointer)paVar1;
      utils::ParseInteger<unsigned_long>((Error *)local_198,&eui64,pbVar3 + 3);
      Value::Value(&local_3a0,(Error *)local_198);
      pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
      EVar2 = (pVVar5->mError).mCode;
      Value::~Value(&local_3a0);
      std::__cxx11::string::~string((string *)(local_198 + 8));
      if (EVar2 == kNone) {
        if (type == kMeshCoP) {
          std::__cxx11::string::_M_assign((string *)&pskd);
          if (0xa0 < (ulong)((long)(aExpr->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(aExpr->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)) {
            std::__cxx11::string::_M_assign((string *)&provisioningUrl);
          }
        }
        (*((commissioner.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
                  (&local_1c0,
                   commissioner.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)type,eui64,&pskd,&provisioningUrl);
        Value::Value(&local_3a0,&local_1c0);
        Value::operator=(__return_storage_ptr__,&local_3a0);
        Value::~Value(&local_3a0);
        psVar8 = &local_1c0.mMessage;
        goto LAB_0011d36a;
      }
    }
    psVar8 = &provisioningUrl;
LAB_0011cfe6:
    std::__cxx11::string::~string((string *)psVar8);
    psVar8 = &pskd;
  }
  else {
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_3a0,"enableall",(allocator *)&port);
    bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    if (bVar4) {
      pskd._M_string_length = 0;
      provisioningUrl._M_dataplus._M_p = (pointer)&provisioningUrl.field_2;
      provisioningUrl._M_string_length = 0;
      pskd.field_2._M_local_buf[0] = '\0';
      provisioningUrl.field_2._M_local_buf[0] = '\0';
      pskd._M_dataplus._M_p = (pointer)paVar1;
      if (type == kMeshCoP) {
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(aExpr->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x61) {
          _port = (pointer)((ulong)_port & 0xffffffff00000000);
          pcStack_3d0 = "too few arguments";
          local_3c8 = 0x11;
          local_3c0._0_4_ = 0;
          local_3c0._4_4_ = 0;
          local_3b0[0] = (parse_func)0x0;
          pcVar6 = "too few arguments";
          local_3b8 = (format_string_checker<char> *)&port;
          while (pcVar7 = pcVar6, pcVar7 != "") {
            pcVar6 = pcVar7 + 1;
            if (*pcVar7 == '}') {
              if ((pcVar6 == "") || (*pcVar6 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar6 = pcVar7 + 2;
            }
            else if (*pcVar7 == '{') {
              pcVar6 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar7,"",(format_string_checker<char> *)&port);
            }
          }
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)&port;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_320,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
          this_00 = (string *)(local_a8 + 8);
          local_a8._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(this_00,(string *)&local_320);
          Value::Value(&local_3a0,(Error *)local_a8);
          goto LAB_0011d342;
        }
        std::__cxx11::string::_M_assign((string *)&pskd);
        if (0x80 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(aExpr->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::string::_M_assign((string *)&provisioningUrl);
        }
      }
      (*((commissioner.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x17])
                (&local_1e8,
                 commissioner.
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)type,&pskd,&provisioningUrl);
      Value::Value(&local_3a0,&local_1e8);
      Value::operator=(__return_storage_ptr__,&local_3a0);
      Value::~Value(&local_3a0);
      psVar8 = &local_1e8.mMessage;
      goto LAB_0011d36a;
    }
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_3a0,"disable",(allocator *)&port);
    bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    if (!bVar4) {
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_3a0,"disableall",(allocator *)&port);
      bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      if (bVar4) {
        (*((commissioner.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x18])
                  (&local_260,
                   commissioner.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)type);
        Value::Value(&local_3a0,&local_260);
        Value::operator=(__return_storage_ptr__,&local_3a0);
        Value::~Value(&local_3a0);
        psVar8 = &local_260.mMessage;
        goto LAB_0011cff0;
      }
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_3a0,"getport",(allocator *)&port);
      bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      if (bVar4) {
        (*((commissioner.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x19])
                  (local_288,
                   commissioner.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&port,(ulong)type);
        Value::Value(&local_3a0,(Error *)local_288);
        pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
        EVar2 = (pVVar5->mError).mCode;
        Value::~Value(&local_3a0);
        std::__cxx11::string::~string((string *)(local_288 + 8));
        if (EVar2 != kNone) goto LAB_0011cff5;
        std::__cxx11::to_string(&local_2f8,(uint)port);
        Value::Value(&local_3a0,&local_2f8);
        Value::operator=(__return_storage_ptr__,&local_3a0);
        Value::~Value(&local_3a0);
        psVar8 = &local_2f8;
        goto LAB_0011cff0;
      }
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_3a0,"setport",(allocator *)&port);
      bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      if (bVar4) {
        pbVar3 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (0x60 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
          utils::ParseInteger<unsigned_short>
                    ((Error *)local_2b0,(unsigned_short *)&provisioningUrl,pbVar3 + 3);
          Value::Value(&local_3a0,(Error *)local_2b0);
          pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
          EVar2 = (pVVar5->mError).mCode;
          Value::~Value(&local_3a0);
          std::__cxx11::string::~string((string *)(local_2b0 + 8));
          if (EVar2 != kNone) goto LAB_0011cff5;
          (*((commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x1a])
                    (&local_2d8,
                     commissioner.
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(ulong)type,(ulong)provisioningUrl._M_dataplus._M_p & 0xffff);
          Value::Value(&local_3a0,&local_2d8);
          Value::operator=(__return_storage_ptr__,&local_3a0);
          Value::~Value(&local_3a0);
          psVar8 = &local_2d8.mMessage;
          goto LAB_0011cff0;
        }
        _port = (pointer)((ulong)uStack_3d4 << 0x20);
        pcStack_3d0 = "too few arguments";
        local_3c8 = 0x11;
        local_3c0._0_4_ = 0;
        local_3c0._4_4_ = 0;
        local_3b0[0] = (parse_func)0x0;
        pcVar6 = "too few arguments";
        local_3b8 = (format_string_checker<char> *)&port;
        while (pcVar7 = pcVar6, pcVar7 != "") {
          pcVar6 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar6 == "") || (*pcVar6 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar6 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar7,"",(format_string_checker<char> *)&port);
          }
        }
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&port;
        ::fmt::v10::vformat_abi_cxx11_
                  (&pskd,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_04);
        psVar8 = &local_f8.mMessage;
        local_f8.mCode = kInvalidArgs;
        std::__cxx11::string::string((string *)psVar8,(string *)&pskd);
        Value::Value(&local_3a0,&local_f8);
      }
      else {
        _port = string_type;
        pcStack_3d0 = "\'{}\' is not a valid sub-command";
        local_3c8 = 0x1f;
        local_3c0._0_4_ = 0;
        local_3c0._4_4_ = 1;
        local_3b0[0] = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar6 = "\'{}\' is not a valid sub-command";
        local_3b8 = (format_string_checker<char> *)&port;
        while (pcVar7 = pcVar6, pcVar7 != "") {
          pcVar6 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar6 == "") || (*pcVar6 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar6 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar7,"",(format_string_checker<char> *)&port);
          }
        }
        pbVar3 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _port = pbVar3[1]._M_dataplus._M_p;
        pcStack_3d0 = (char *)pbVar3[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)&port;
        ::fmt::v10::vformat_abi_cxx11_(&pskd,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_03)
        ;
        psVar8 = &local_120.mMessage;
        local_120.mCode = kInvalidCommand;
        std::__cxx11::string::string((string *)psVar8,(string *)&pskd);
        Value::Value(&local_3a0,&local_120);
      }
LAB_0011cfcb:
      Value::operator=(__return_storage_ptr__,&local_3a0);
      Value::~Value(&local_3a0);
      goto LAB_0011cfe6;
    }
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x61) {
      _port = (pointer)((ulong)_port & 0xffffffff00000000);
      pcStack_3d0 = "too few arguments";
      local_3c8 = 0x11;
      local_3c0._0_4_ = 0;
      local_3c0._4_4_ = 0;
      local_3b0[0] = (parse_func)0x0;
      pcVar6 = "too few arguments";
      local_3b8 = (format_string_checker<char> *)&port;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)&port);
        }
      }
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&port;
      ::fmt::v10::vformat_abi_cxx11_
                (&pskd,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
      psVar8 = &local_d0.mMessage;
      local_d0.mCode = kInvalidArgs;
      std::__cxx11::string::string((string *)psVar8,(string *)&pskd);
      Value::Value(&local_3a0,&local_d0);
      goto LAB_0011cfcb;
    }
    utils::ParseInteger<unsigned_long>
              ((Error *)local_210,(unsigned_long *)&provisioningUrl,pbVar3 + 3);
    Value::Value(&local_3a0,(Error *)local_210);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_3a0);
    EVar2 = (pVVar5->mError).mCode;
    Value::~Value(&local_3a0);
    std::__cxx11::string::~string((string *)(local_210 + 8));
    if (EVar2 != kNone) goto LAB_0011cff5;
    (*((commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_CommissionerHandler)._vptr_CommissionerHandler[0x16])
              (&local_238,
               commissioner.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)type,provisioningUrl._M_dataplus._M_p);
    Value::Value(&local_3a0,&local_238);
    Value::operator=(__return_storage_ptr__,&local_3a0);
    Value::~Value(&local_3a0);
    psVar8 = &local_238.mMessage;
  }
LAB_0011cff0:
  std::__cxx11::string::~string((string *)psVar8);
LAB_0011cff5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessJoiner(const Expression &aExpr)
{
    Value              value;
    JoinerType         type;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = GetJoinerType(type, aExpr[2]));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    if (CaseInsensitiveEqual(aExpr[1], "enable"))
    {
        uint64_t    eui64;
        std::string pskd;
        std::string provisioningUrl;

        VerifyOrExit(aExpr.size() >= (type == JoinerType::kMeshCoP ? 5 : 4),
                     value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        if (type == JoinerType::kMeshCoP)
        {
            pskd = aExpr[4];
            if (aExpr.size() >= 6)
            {
                provisioningUrl = aExpr[5];
            }
        }

        SuccessOrExit(value = commissioner->EnableJoiner(type, eui64, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "enableall"))
    {
        std::string pskd;
        std::string provisioningUrl;
        if (type == JoinerType::kMeshCoP)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            pskd = aExpr[3];
            if (aExpr.size() >= 5)
            {
                provisioningUrl = aExpr[4];
            }
        }

        SuccessOrExit(value = commissioner->EnableAllJoiners(type, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disable"))
    {
        uint64_t eui64;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        SuccessOrExit(value = commissioner->DisableJoiner(type, eui64));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disableall"))
    {
        SuccessOrExit(value = commissioner->DisableAllJoiners(type));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "getport"))
    {
        uint16_t port;
        SuccessOrExit(value = commissioner->GetJoinerUdpPort(port, type));
        value = std::to_string(port);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "setport"))
    {
        uint16_t port;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(port, aExpr[3]));
        SuccessOrExit(value = commissioner->SetJoinerUdpPort(type, port));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}